

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_array.cc
# Opt level: O3

void __thiscall ArrayType::~ArrayType(ArrayType *this)

{
  ~ArrayType(this);
  operator_delete(this,0x248);
  return;
}

Assistant:

ArrayType::~ArrayType()
	{
	delete arraylength_var_field_;
	delete elem_it_var_field_;
	delete elem_var_field_;
	delete elem_dataptr_var_field_;
	delete elem_input_var_field_;

	delete elem_dataptr_until_expr_;
	}